

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O0

bool __thiscall AInventory::CanPickup(AInventory *this,AActor *toucher)

{
  bool bVar1;
  uint uVar2;
  MetaClass *pMVar3;
  PClassPlayerPawn **ppPVar4;
  uint local_30;
  uint local_2c;
  uint i_1;
  uint i;
  PClassInventory *ai;
  AActor *toucher_local;
  AInventory *this_local;
  
  if (toucher == (AActor *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pMVar3 = GetClass(this);
    uVar2 = TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::Size(&pMVar3->RestrictedToPlayerClass);
    if (uVar2 == 0) {
      for (local_30 = 0;
          uVar2 = TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::Size
                            (&pMVar3->ForbiddenToPlayerClass), local_30 < uVar2;
          local_30 = local_30 + 1) {
        ppPVar4 = TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::operator[]
                            (&pMVar3->ForbiddenToPlayerClass,(ulong)local_30);
        bVar1 = DObject::IsKindOf((DObject *)toucher,(PClass *)*ppPVar4);
        if (bVar1) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      for (local_2c = 0;
          uVar2 = TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::Size
                            (&pMVar3->RestrictedToPlayerClass), local_2c < uVar2;
          local_2c = local_2c + 1) {
        ppPVar4 = TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::operator[]
                            (&pMVar3->RestrictedToPlayerClass,(ulong)local_2c);
        bVar1 = DObject::IsKindOf((DObject *)toucher,(PClass *)*ppPVar4);
        if (bVar1) {
          return true;
        }
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AInventory::CanPickup (AActor *toucher)
{
	if (!toucher)
		return false;

	PClassInventory *ai = GetClass();
	// Is the item restricted to certain player classes?
	if (ai->RestrictedToPlayerClass.Size() != 0)
	{
		for (unsigned i = 0; i < ai->RestrictedToPlayerClass.Size(); ++i)
		{
			if (toucher->IsKindOf(ai->RestrictedToPlayerClass[i]))
				return true;
		}
		return false;
	}
	// Or is it forbidden to certain other classes?
	else
	{
		for (unsigned i = 0; i < ai->ForbiddenToPlayerClass.Size(); ++i)
		{
			if (toucher->IsKindOf(ai->ForbiddenToPlayerClass[i]))
				return false;
		}
	}
	return true;
}